

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSampleID>::
verifyImageData(TestStatus *__return_storage_ptr__,
               MSInstance<vkt::pipeline::multisample::MSInstanceSampleID> *this,
               VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
               vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
               *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  ConstPixelBufferAccess local_70;
  ulong local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  uVar4 = (ulong)imageMSInfo->samples;
  if (uVar4 != 0) {
    local_38 = (string *)&__return_storage_ptr__->m_description;
    local_40 = &(__return_storage_ptr__->m_description).field_2;
    uVar3 = (imageMSInfo->extent).depth;
    imageRSInfo = (VkImageCreateInfo *)(ulong)uVar3;
    uVar5 = 0;
    local_70.m_data = __return_storage_ptr__;
    local_48 = uVar4;
    do {
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        uVar1 = (imageMSInfo->extent).height;
        uVar2 = 0;
        uVar6 = uVar1;
        do {
          if (uVar6 == 0) {
            uVar6 = 0;
          }
          else {
            uVar3 = (imageMSInfo->extent).width;
            uVar6 = 0;
            do {
              bVar7 = uVar3 != 0;
              uVar3 = 0;
              if (bVar7) {
                uVar1 = 0;
                do {
                  tcu::ConstPixelBufferAccess::getPixelInt
                            (&local_70,
                             (int)uVar5 * 0x28 +
                             (int)(dataPerSample->
                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                  )._M_impl.super__Vector_impl_data._M_start,uVar1,uVar6);
                  if (uVar5 != ((ulong)local_70.m_format & 0xffffffff)) {
                    local_70.m_format = (TextureFormat)(local_70.m_size.m_data + 2);
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_70,"gl_SampleID does not have correct value","");
                    __return_storage_ptr__ = (TestStatus *)local_70.m_data;
                    *(qpTestResult *)local_70.m_data = QP_TEST_RESULT_FAIL;
                    (((string *)((long)local_70.m_data + 8))->_M_dataplus)._M_p = (pointer)local_40;
                    std::__cxx11::string::_M_construct<char*>
                              (local_38,local_70.m_format,
                               local_70.m_size.m_data._0_8_ + (long)local_70.m_format);
                    goto LAB_004b7c5d;
                  }
                  uVar1 = uVar1 + 1;
                  uVar3 = (imageMSInfo->extent).width;
                } while (uVar1 < uVar3);
                uVar1 = (imageMSInfo->extent).height;
              }
              uVar6 = uVar6 + 1;
            } while (uVar6 < uVar1);
            imageRSInfo = (VkImageCreateInfo *)(ulong)(imageMSInfo->extent).depth;
            uVar4 = local_48;
            uVar6 = uVar1;
          }
          uVar2 = uVar2 + 1;
          uVar3 = (uint)imageRSInfo;
        } while (uVar2 < uVar3);
      }
      uVar5 = uVar5 + 1;
      __return_storage_ptr__ = (TestStatus *)local_70.m_data;
    } while (uVar5 != uVar4);
  }
  local_70.m_format = (TextureFormat)(local_70.m_size.m_data + 2);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Passed","",imageRSInfo);
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_70.m_format,
             local_70.m_size.m_data._0_8_ + (long)local_70.m_format);
LAB_004b7c5d:
  if (local_70.m_format != (TextureFormat)(local_70.m_size.m_data + 2)) {
    operator_delete((void *)local_70.m_format,local_70._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSampleID>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																			 const vk::VkImageCreateInfo&						imageRSInfo,
																			 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																			 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	DE_UNREF(imageRSInfo);
	DE_UNREF(dataRS);

	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
	{
		for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
		for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
		for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
		{
			const deUint32 sampleID = dataPerSample[sampleNdx].getPixelUint(x, y, z).x();

			if (sampleID != sampleNdx)
				return tcu::TestStatus::fail("gl_SampleID does not have correct value");
		}
	}

	return tcu::TestStatus::pass("Passed");
}